

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteResult.h
# Opt level: O0

void __thiscall
oout::SuiteResult::SuiteResult<oout::SuccessResult,oout::FailureResult,oout::SuccessResult>
          (SuiteResult *this,shared_ptr<oout::SuccessResult> *tests,
          shared_ptr<oout::FailureResult> *tests_1,shared_ptr<oout::SuccessResult> *tests_2)

{
  initializer_list<std::shared_ptr<const_oout::Result>_> __l;
  shared_ptr<const_oout::Result> *local_b8;
  allocator<std::shared_ptr<const_oout::Result>_> local_81;
  shared_ptr<const_oout::Result> local_80;
  shared_ptr<oout::Result_const> local_70 [16];
  shared_ptr<oout::Result_const> local_60 [16];
  shared_ptr<const_oout::Result> local_50;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_40;
  shared_ptr<oout::SuccessResult> *local_28;
  shared_ptr<oout::SuccessResult> *tests_local_2;
  shared_ptr<oout::FailureResult> *tests_local_1;
  shared_ptr<oout::SuccessResult> *tests_local;
  SuiteResult *this_local;
  
  local_28 = tests_2;
  tests_local_2 = (shared_ptr<oout::SuccessResult> *)tests_1;
  tests_local_1 = (shared_ptr<oout::FailureResult> *)tests;
  tests_local = (shared_ptr<oout::SuccessResult> *)this;
  std::shared_ptr<oout::Result_const>::shared_ptr<oout::SuccessResult,void>
            ((shared_ptr<oout::Result_const> *)&local_80,tests);
  std::shared_ptr<oout::Result_const>::shared_ptr<oout::FailureResult,void>
            (local_70,(shared_ptr<oout::FailureResult> *)tests_local_2);
  std::shared_ptr<oout::Result_const>::shared_ptr<oout::SuccessResult,void>(local_60,local_28);
  local_50.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_50.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_80;
  std::allocator<std::shared_ptr<const_oout::Result>_>::allocator(&local_81);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list(&local_40,__l,&local_81);
  SuiteResult(this,&local_40);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  ~list(&local_40);
  std::allocator<std::shared_ptr<const_oout::Result>_>::~allocator(&local_81);
  local_b8 = &local_50;
  do {
    local_b8 = local_b8 + -1;
    std::shared_ptr<const_oout::Result>::~shared_ptr(local_b8);
  } while (local_b8 != &local_80);
  return;
}

Assistant:

explicit SuiteResult(const std::shared_ptr<T> & ... tests)
		: SuiteResult(std::list<std::shared_ptr<const Result>>{
			tests...
		})
	{
	}